

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontal.cpp
# Opt level: O2

void __thiscall
cppurses::layout::Horizontal::collect_space
          (Horizontal *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int width_left)

{
  size_t sVar1;
  Type TVar2;
  pointer pDVar3;
  ulong uVar4;
  iterator __begin2;
  pointer pDVar5;
  _Elt_pointer puVar6;
  ulong uVar7;
  long lVar8;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  pointer pDVar9;
  _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *this_00;
  Dimensions_reference *d_5;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  int local_ec;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  ulong local_d0;
  double local_c8;
  double dStack_c0;
  Horizontal *local_b8;
  deque<unsigned_long,_std::allocator<unsigned_long>_> width_deductions;
  _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_60;
  _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_48;
  
  if (width_left != 0) {
    pDVar3 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 0;
    pDVar5 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (pDVar9 = pDVar5; pDVar9 != pDVar3; pDVar9 = pDVar9 + 1) {
      TVar2 = (pDVar9->widget->width_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4cU >> (TVar2 & 0x1f) & 1) != 0)) {
        lVar8 = lVar8 + (pDVar9->widget->width_policy).stretch_;
      }
    }
    auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = 0x45300000;
    dStack_c0 = auVar11._8_8_ - 1.9342813113834067e+25;
    local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dVar17 = 0.0;
    for (; pDVar5 != pDVar3; pDVar5 = pDVar5 + 1) {
      TVar2 = (pDVar5->widget->width_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4cU >> (TVar2 & 0x1f) & 1) != 0)) {
        sVar1 = (pDVar5->widget->width_policy).stretch_;
        auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
        auVar12._8_4_ = (int)(sVar1 >> 0x20);
        auVar12._12_4_ = 0x45300000;
        dVar17 = dVar17 + 1.0 / (((auVar12._8_8_ - 1.9342813113834067e+25) +
                                 (auVar12._0_8_ - 4503599627370496.0)) / local_c8);
      }
    }
    local_b8 = this;
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_Deque_base
              (&width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
    pDVar3 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = 0;
    dVar10 = local_c8;
    for (pDVar5 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar3; pDVar5 = pDVar5 + 1)
    {
      TVar2 = (pDVar5->widget->width_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4cU >> (TVar2 & 0x1f) & 1) != 0)) {
        sVar1 = (pDVar5->widget->width_policy).stretch_;
        auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
        auVar13._8_4_ = (int)(sVar1 >> 0x20);
        auVar13._12_4_ = 0x45300000;
        dVar10 = ((1.0 / (((auVar13._8_8_ - 1.9342813113834067e+25) +
                          (auVar13._0_8_ - 4503599627370496.0)) / dVar10)) / dVar17) *
                 (double)-width_left;
        local_d0 = (ulong)dVar10;
        local_d0 = (long)(dVar10 - 9.223372036854776e+18) & (long)local_d0 >> 0x3f | local_d0;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&width_deductions,&local_d0);
        puVar6 = width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar6 = width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        uVar4 = *pDVar5->width;
        uVar7 = (pDVar5->widget->width_policy).min_;
        dVar10 = local_c8;
        if (uVar4 - puVar6[-1] < uVar7) {
          *pDVar5->width = uVar7;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::erase(widgets,(Dimensions_reference *)
                          ((long)(widgets->
                                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                 )._M_impl.super__Vector_impl_data._M_start - lVar8));
          this_00 = &local_48;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    *)this_00,widgets);
          collect_space(local_b8,(vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                  *)this_00,((int)uVar4 - (int)uVar7) + width_left);
          goto LAB_00157cdc;
        }
      }
      lVar8 = lVar8 + -0x18;
    }
    pDVar3 = (widgets->
             super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_ec = width_left;
    for (pDVar5 = (widgets->
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  )._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar3; pDVar5 = pDVar5 + 1)
    {
      TVar2 = (pDVar5->widget->width_policy).type_;
      if ((TVar2 < (Ignored|Minimum)) && ((0x4cU >> (TVar2 & 0x1f) & 1) != 0)) {
        uVar4 = *pDVar5->width;
        uVar7 = uVar4 - *width_deductions.
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur;
        if (uVar4 < *width_deductions.
                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur) {
          uVar7 = 0;
        }
        *pDVar5->width = uVar7;
        local_ec = local_ec +
                   (int)*width_deductions.
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&width_deductions);
      }
    }
    if (local_ec != 0) {
      pDVar3 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = 0;
      pDVar5 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (pDVar9 = pDVar5; pDVar9 != pDVar3; pDVar9 = pDVar9 + 1) {
        if ((pDVar9->widget->width_policy).type_ == Expanding) {
          lVar8 = lVar8 + (pDVar9->widget->width_policy).stretch_;
        }
      }
      auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = 0x45300000;
      dStack_c0 = auVar14._8_8_ - 1.9342813113834067e+25;
      local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
      dVar17 = 0.0;
      for (; pDVar5 != pDVar3; pDVar5 = pDVar5 + 1) {
        if ((pDVar5->widget->width_policy).type_ == Expanding) {
          sVar1 = (pDVar5->widget->width_policy).stretch_;
          auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
          auVar15._8_4_ = (int)(sVar1 >> 0x20);
          auVar15._12_4_ = 0x45300000;
          dVar17 = dVar17 + 1.0 / (((auVar15._8_8_ - 1.9342813113834067e+25) +
                                   (auVar15._0_8_ - 4503599627370496.0)) / local_c8);
        }
      }
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&width_deductions);
      pDVar5 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (widgets->
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = 0;
      dVar10 = local_c8;
LAB_00157b74:
      if (pDVar5 == pDVar3) {
        pDVar3 = (widgets->
                 super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pDVar5 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar3;
            pDVar5 = pDVar5 + 1) {
          if ((pDVar5->widget->width_policy).type_ == Expanding) {
            uVar4 = *pDVar5->width;
            uVar7 = uVar4 - *width_deductions.
                             super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur;
            if (uVar4 < *width_deductions.
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur) {
              uVar7 = 0;
            }
            *pDVar5->width = uVar7;
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&width_deductions);
          }
        }
      }
      else {
        if ((pDVar5->widget->width_policy).type_ != Expanding) goto LAB_00157c47;
        sVar1 = (pDVar5->widget->width_policy).stretch_;
        auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
        auVar16._8_4_ = (int)(sVar1 >> 0x20);
        auVar16._12_4_ = 0x45300000;
        dVar10 = ((1.0 / (((auVar16._8_8_ - 1.9342813113834067e+25) +
                          (auVar16._0_8_ - 4503599627370496.0)) / dVar10)) / dVar17) *
                 (double)-local_ec;
        local_d0 = (ulong)dVar10;
        local_d0 = (long)(dVar10 - 9.223372036854776e+18) & (long)local_d0 >> 0x3f | local_d0;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&width_deductions,&local_d0);
        puVar6 = width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar6 = width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        uVar4 = *pDVar5->width;
        uVar7 = (pDVar5->widget->width_policy).min_;
        dVar10 = local_c8;
        if (uVar7 <= uVar4 - puVar6[-1]) goto LAB_00157c47;
        *pDVar5->width = uVar7;
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::erase(widgets,(Dimensions_reference *)
                        ((long)(widgets->
                               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                               )._M_impl.super__Vector_impl_data._M_start - lVar8));
        this_00 = &local_60;
        std::
        vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::vector((vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  *)this_00,widgets);
        collect_space(local_b8,(vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                *)this_00,local_ec + ((int)uVar4 - (int)uVar7));
LAB_00157cdc:
        std::
        _Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
        ::~_Vector_base(this_00);
      }
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              (&width_deductions.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  return;
LAB_00157c47:
  pDVar5 = pDVar5 + 1;
  lVar8 = lVar8 + -0x18;
  goto LAB_00157b74;
}

Assistant:

void Horizontal::collect_space(std::vector<Dimensions_reference> widgets,
                               int width_left) {
    if (width_left == 0) {
        return;
    }
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    double total_inverse{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go under min_width
    // then assign min value and recurse without that widget in vector.
    std::deque<std::size_t> width_deductions;
    int index{0};
    auto to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    if (width_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    total_inverse = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go over max_width
    // then assign max value and recurse without that widget in vector.
    width_deductions.clear();
    index = 0;
    to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }
    // Change this to distribute the space, it might not be too small
    if (width_left != 0) {
        return;
    }
}